

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O3

ggml_tensor * ggml_abs_impl(ggml_context *ctx,ggml_tensor *a,_Bool inplace)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  ggml_tensor *pgVar3;
  undefined7 in_register_00000011;
  
  if ((int)CONCAT71(in_register_00000011,inplace) == 0) {
    pgVar1 = a->grad;
    pgVar3 = (ggml_tensor *)0x0;
    pgVar2 = ggml_new_tensor_impl(ctx,a->type,a->n_dims,a->ne,(void *)0x0);
    pgVar2->op = GGML_OP_ABS;
    if (pgVar1 != (ggml_tensor *)0x0) {
      pgVar3 = ggml_new_tensor_impl(ctx,pgVar2->type,pgVar2->n_dims,pgVar2->ne,(void *)0x0);
    }
  }
  else {
    pgVar2 = ggml_new_tensor_impl(ctx,a->type,a->n_dims,a->ne,a->data);
    pgVar2->op = GGML_OP_ABS;
    pgVar3 = (ggml_tensor *)0x0;
  }
  pgVar2->grad = pgVar3;
  pgVar2->src0 = a;
  pgVar2->src1 = (ggml_tensor *)0x0;
  return pgVar2;
}

Assistant:

struct ggml_tensor * ggml_abs_impl(
        struct ggml_context * ctx,
        struct ggml_tensor * a,
        bool inplace) {
    bool is_node = false;

    if (!inplace && (a->grad)) {
        is_node = true;
    }

    struct ggml_tensor * result = inplace ? ggml_view_tensor(ctx, a) : ggml_dup_tensor(ctx, a);

    result->op   = GGML_OP_ABS;
    result->grad = is_node ? ggml_dup_tensor(ctx, result) : NULL;
    result->src0 = a;
    result->src1 = NULL;

    return result;
}